

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nes_system.c
# Opt level: O2

void nes_system_read_memory
               (nes_system *system,nes_memory_type memory_type,uint16_t address,void *buffer,
               size_t buffer_size)

{
  code *pcVar1;
  undefined1 uVar2;
  ulong uVar3;
  
  if (memory_type < (NES_MEMORY_TYPE_OAM|NES_MEMORY_TYPE_PPU)) {
    pcVar1 = (code *)(&PTR_nes_system_read_cpu_byte_0010cdb8)[memory_type];
    for (uVar3 = 0; uVar3 = uVar3 & 0xffff, uVar3 < buffer_size; uVar3 = (ulong)((int)uVar3 + 1)) {
      uVar2 = (*pcVar1)(system,(uint)address + (int)uVar3 & 0xffff);
      *(undefined1 *)((long)buffer + uVar3) = uVar2;
    }
  }
  return;
}

Assistant:

void nes_system_read_memory(nes_system* system, nes_memory_type memory_type, uint16_t address, void* buffer, size_t buffer_size)
{
    uint8_t (*read_byte)(nes_system*, uint16_t) = 0;
    switch (memory_type)
    {
        case NES_MEMORY_TYPE_CPU : read_byte = nes_system_read_cpu_byte; break;
        case NES_MEMORY_TYPE_PPU : read_byte = nes_system_read_ppu_byte; break;
        case NES_MEMORY_TYPE_OAM : read_byte = nes_system_read_oam_byte; break;
        default: break;
    }

    if (!read_byte)
        return;

    for (uint16_t i = 0; i < buffer_size; ++i)
        *((uint8_t*)buffer + i) = read_byte(system, address + i);
}